

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O3

Node verona::make_fq(Lookup *lookup,bool fresh)

{
  size_type *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Rb_tree_header *p_Var3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  iterator pTVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 this;
  element_type *peVar11;
  element_type *peVar12;
  uint uVar13;
  NodeDef *__tmp;
  Token *pTVar14;
  pointer psVar15;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *extraout_RAX_06;
  element_type *extraout_RAX_07;
  element_type *extraout_RAX_08;
  element_type *peVar16;
  element_type *extraout_RAX_09;
  element_type *extraout_RAX_10;
  element_type *extraout_RAX_11;
  int iVar17;
  undefined8 uVar18;
  ulong uVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var20;
  pointer psVar21;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  uint uVar22;
  undefined7 in_register_00000031;
  NodeDef *pNVar23;
  void *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  ulong __val;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  Node NVar24;
  Node t;
  Node path;
  undefined1 local_258 [24];
  undefined1 *local_240;
  Token local_238;
  Token local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [40];
  NodeDef *pNStack_1d0;
  undefined1 local_1c8 [24];
  NodeDef *local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  undefined1 local_198 [24];
  NodeDef *pNStack_180;
  undefined1 local_178 [24];
  NodeDef *pNStack_160;
  undefined1 local_158 [56];
  element_type *peStack_120;
  undefined1 local_118 [24];
  element_type *peStack_100;
  undefined1 local_f8 [24];
  element_type *peStack_e0;
  undefined1 local_d8 [24];
  element_type *peStack_c0;
  element_type *local_b0;
  Node local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Node local_88;
  Node local_78;
  Token local_68;
  Token local_60;
  Token local_58;
  WFLookup local_50;
  
  pNVar23 = (NodeDef *)CONCAT71(in_register_00000031,fresh);
  local_258._0_8_ = Class;
  local_258._8_8_ = TypeAlias;
  local_258._16_8_ = TypeParam;
  local_240 = Trait;
  local_238.def = (TokenDef *)Function;
  pTVar14 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (local_258,&local_230,
                       &((pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                         super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        type_);
  if (pTVar14 == &local_230) {
    (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
         super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar16 = (element_type *)
              (pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
              super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar16;
    _Var20._M_pi = extraout_RDX;
    if (peVar16 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                  &(peVar16->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->
                  _M_refcount;
        *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var2 = &((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                  &(peVar16->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->
                  _M_refcount;
        *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      }
    }
    goto LAB_00156845;
  }
  local_258._0_8_ = TypePath;
  local_b0 = (element_type *)lookup;
  trieste::NodeDef::create((NodeDef *)local_1f8,(Token *)local_258);
  local_208._0_8_ =
       (pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
       super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_208._8_8_ =
       (pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
       super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((element_type *)local_208._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(((element_type *)local_208._8_8_)->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(((element_type *)local_208._8_8_)->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_158._40_8_ = pNVar23;
  if ((NodeDef *)local_208._0_8_ != (NodeDef *)0x0) {
    uVar18 = (ulong)in_EDX & 0xff;
    local_1f8._20_4_ = (undefined4)uVar18;
    do {
      uVar9 = local_1f8._8_8_;
      uVar8 = local_1f8._0_8_;
      iVar17 = (int)uVar18;
      pTVar5 = (iterator)((TokenDef *)(local_208._0_8_ + 0x10))->name;
      if (pTVar5 == (iterator)Class) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
          }
        }
        local_258._0_8_ = TypeClassName;
        trieste::NodeDef::create((NodeDef *)local_158,(Token *)local_258);
        local_1c8._16_8_ = Ident;
        trieste::operator/((WFLookup *)local_258,(Node *)local_208,(Token *)(local_1c8 + 0x10));
        uVar18 = local_258._16_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_d8._16_8_ = (TokenDef *)0x0;
          peStack_c0 = (element_type *)0x0;
        }
        else {
          trieste::NodeDef::clone
                    ((NodeDef *)(local_d8 + 0x10),(__fn *)local_258._8_8_,__child_stack,iVar17,in_R8
                    );
          if (peStack_c0 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                           *)&peStack_c0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
              (p_Var3->_M_header)._M_color = (p_Var3->_M_header)._M_color + _S_black;
              UNLOCK();
            }
            else {
              p_Var3 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                           *)&peStack_c0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
              (p_Var3->_M_header)._M_color = (p_Var3->_M_header)._M_color + _S_black;
            }
          }
        }
        local_228._M_allocated_capacity = local_d8._16_8_;
        local_228._8_8_ = peStack_c0;
        trieste::NodeDef::push_back((NodeDef *)local_158._0_8_,(Node *)&local_228);
        if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        this = local_158._8_8_;
        uVar10 = local_158._0_8_;
        local_158._0_8_ = (NodeDef *)0x0;
        local_158._8_8_ = (element_type *)0x0;
        make_typeargs(&local_78,(Lookup *)local_208,SUB81(local_158._40_8_,0));
        local_228._M_allocated_capacity =
             (size_type)
             local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_228._8_8_ =
             local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if ((element_type *)
            local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (((_Rb_tree_header *)
             &(local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count)->_M_header)._M_color =
                 (((_Rb_tree_header *)
                  &(local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
            UNLOCK();
          }
          else {
            (((_Rb_tree_header *)
             &(local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count)->_M_header)._M_color =
                 (((_Rb_tree_header *)
                  &(local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
          }
        }
        trieste::NodeDef::push_back((NodeDef *)uVar10,(Node *)&local_228);
        if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        local_228._M_allocated_capacity = uVar10;
        local_228._8_8_ = this;
        if ((element_type *)this != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(this + 8) = (int)*(size_type *)(this + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(this + 8) = (int)*(size_type *)(this + 8) + 1;
          }
        }
        trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_228);
        if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
        }
        if ((element_type *)this != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        if ((element_type *)
            local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (peStack_c0 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_c0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
        }
        pNVar23 = (NodeDef *)local_158._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_);
          pNVar23 = (NodeDef *)local_158._8_8_;
        }
LAB_00155e02:
        if (pNVar23 != (NodeDef *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar23);
        }
      }
      else {
        iVar17 = 0x2d6d48;
        if (pTVar5 == (iterator)TypeAlias) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
            }
          }
          local_258._0_8_ = &TypeAliasName;
          trieste::NodeDef::create((NodeDef *)(local_178 + 0x10),(Token *)local_258);
          local_1c8._16_8_ = Ident;
          trieste::operator/((WFLookup *)local_258,(Node *)local_208,(Token *)(local_1c8 + 0x10));
          uVar18 = local_258._16_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_d8._0_8_ = (element_type *)0x0;
            local_d8._8_8_ = (element_type *)0x0;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)local_d8,(__fn *)local_258._8_8_,__child_stack_00,iVar17,in_R8);
            if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (((_Rb_tree_header *)(local_d8._8_8_ + 8))->_M_header)._M_color =
                     (((_Rb_tree_header *)(local_d8._8_8_ + 8))->_M_header)._M_color + _S_black;
                UNLOCK();
              }
              else {
                (((_Rb_tree_header *)(local_d8._8_8_ + 8))->_M_header)._M_color =
                     (((_Rb_tree_header *)(local_d8._8_8_ + 8))->_M_header)._M_color + _S_black;
              }
            }
          }
          local_228._M_allocated_capacity = local_d8._0_8_;
          local_228._8_8_ = local_d8._8_8_;
          trieste::NodeDef::push_back((NodeDef *)local_178._16_8_,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          pNVar23 = pNStack_160;
          uVar10 = local_178._16_8_;
          local_178._16_8_ = (NodeDef *)0x0;
          pNStack_160 = (NodeDef *)0x0;
          make_typeargs(&local_88,(Lookup *)local_208,SUB81(local_158._40_8_,0));
          local_228._M_allocated_capacity =
               (size_type)
               local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_228._8_8_ =
               local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          if ((element_type *)
              local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (((_Rb_tree_header *)
               &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color =
                   (((_Rb_tree_header *)
                    &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
              UNLOCK();
            }
            else {
              (((_Rb_tree_header *)
               &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color =
                   (((_Rb_tree_header *)
                    &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar10,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          local_228._M_allocated_capacity = uVar10;
          local_228._8_8_ = pNVar23;
          if (pNVar23 != (NodeDef *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &((string *)&pNVar23->super_enable_shared_from_this<trieste::NodeDef>)->
                        _M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &((string *)&pNVar23->super_enable_shared_from_this<trieste::NodeDef>)->
                        _M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
          }
          if (pNVar23 != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar23);
          }
          if ((element_type *)
              local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
          }
          pNVar23 = pNStack_160;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_);
            pNVar23 = pNStack_160;
          }
          goto LAB_00155e02;
        }
        iVar17 = 0x2d6f58;
        if (pTVar5 == (iterator)TypeParam) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
            }
          }
          local_258._0_8_ = TypeParamName;
          trieste::NodeDef::create((NodeDef *)local_178,(Token *)local_258);
          local_1c8._16_8_ = Ident;
          trieste::operator/((WFLookup *)local_258,(Node *)local_208,(Token *)(local_1c8 + 0x10));
          uVar18 = local_258._16_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_f8._16_8_ = (TokenDef *)0x0;
            peStack_e0 = (element_type *)0x0;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)(local_f8 + 0x10),(__fn *)local_258._8_8_,__child_stack_01,iVar17,
                       in_R8);
            if (peStack_e0 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                             *)&peStack_e0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
                (p_Var3->_M_header)._M_color = (p_Var3->_M_header)._M_color + _S_black;
                UNLOCK();
              }
              else {
                p_Var3 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                             *)&peStack_e0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
                (p_Var3->_M_header)._M_color = (p_Var3->_M_header)._M_color + _S_black;
              }
            }
          }
          local_228._M_allocated_capacity = local_f8._16_8_;
          local_228._8_8_ = peStack_e0;
          trieste::NodeDef::push_back((NodeDef *)local_178._0_8_,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          uVar10 = local_178._8_8_;
          local_228._M_allocated_capacity = local_178._0_8_;
          local_178._0_8_ = (NodeDef *)0x0;
          local_178._8_8_ = (element_type *)0x0;
          local_228._8_8_ = uVar10;
          if ((element_type *)uVar10 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(uVar10 + 8) = (int)*(size_type *)(uVar10 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(uVar10 + 8) = (int)*(size_type *)(uVar10 + 8) + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
          }
          if ((element_type *)uVar10 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          }
          if (peStack_e0 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_e0);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
          }
          pNVar23 = (NodeDef *)local_178._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_);
            pNVar23 = (NodeDef *)local_178._8_8_;
          }
          goto LAB_00155e02;
        }
        iVar17 = 0x2d6ec8;
        if (pTVar5 == (iterator)Trait) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
            }
          }
          local_258._0_8_ = TypeTraitName;
          trieste::NodeDef::create((NodeDef *)(local_198 + 0x10),(Token *)local_258);
          local_1c8._16_8_ = Ident;
          trieste::operator/((WFLookup *)local_258,(Node *)local_208,(Token *)(local_1c8 + 0x10));
          uVar18 = local_258._16_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(flag *)(local_258._16_8_ + 8) = *(flag *)(local_258._16_8_ + 8) + 1;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_f8._0_8_ = (element_type *)0x0;
            local_f8._8_8_ = (element_type *)0x0;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)local_f8,(__fn *)local_258._8_8_,__child_stack_02,iVar17,in_R8);
            if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (((_Rb_tree_header *)(local_f8._8_8_ + 8))->_M_header)._M_color =
                     (((_Rb_tree_header *)(local_f8._8_8_ + 8))->_M_header)._M_color + _S_black;
                UNLOCK();
              }
              else {
                (((_Rb_tree_header *)(local_f8._8_8_ + 8))->_M_header)._M_color =
                     (((_Rb_tree_header *)(local_f8._8_8_ + 8))->_M_header)._M_color + _S_black;
              }
            }
          }
          local_228._M_allocated_capacity = local_f8._0_8_;
          local_228._8_8_ = local_f8._8_8_;
          trieste::NodeDef::push_back((NodeDef *)local_198._16_8_,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          pNVar23 = pNStack_180;
          local_228._M_allocated_capacity = local_198._16_8_;
          local_198._16_8_ = (NodeDef *)0x0;
          pNStack_180 = (NodeDef *)0x0;
          local_228._8_8_ = pNVar23;
          if (pNVar23 != (NodeDef *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &((string *)&pNVar23->super_enable_shared_from_this<trieste::NodeDef>)->
                        _M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &((string *)&pNVar23->super_enable_shared_from_this<trieste::NodeDef>)->
                        _M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_228);
          if ((element_type *)local_228._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
          }
          if (pNVar23 != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar23);
          }
          if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
          }
          pNVar23 = pNStack_180;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_);
            pNVar23 = pNStack_180;
          }
          goto LAB_00155e02;
        }
        if (pTVar5 == (iterator)Function) {
          local_1c8._16_8_ = &Params;
          trieste::operator/((WFLookup *)local_258,(Node *)local_208,(Token *)(local_1c8 + 0x10));
          __val = (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_258._8_8_ + 0x60))->
                        _vptr__Sp_counted_base -
                  *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_258._8_8_ + 0x50))->_M_use_count >> 4;
          uVar22 = 1;
          if (9 < __val) {
            uVar19 = __val;
            uVar13 = 4;
            do {
              uVar22 = uVar13;
              if (uVar19 < 100) {
                uVar22 = uVar22 - 2;
                goto LAB_00155eb4;
              }
              if (uVar19 < 1000) {
                uVar22 = uVar22 - 1;
                goto LAB_00155eb4;
              }
              if (uVar19 < 10000) goto LAB_00155eb4;
              bVar7 = 99999 < uVar19;
              uVar19 = uVar19 / 10000;
              uVar13 = uVar22 + 4;
            } while (bVar7);
            uVar22 = uVar22 + 1;
          }
LAB_00155eb4:
          local_228._M_allocated_capacity = (size_type)local_218;
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_228,(ulong)uVar22,'\0');
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_228._M_allocated_capacity,local_228._8_4_,__val);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._16_8_);
          }
          uVar18 = local_1f8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
            }
          }
          local_158._32_8_ = local_1f8._8_8_;
          local_258._0_8_ = Selector;
          trieste::NodeDef::create((NodeDef *)local_198,(Token *)local_258);
          local_58.def = (TokenDef *)Ref;
          trieste::operator/((WFLookup *)(local_1c8 + 0x10),(Node *)local_208,&local_58);
          if ((element_type *)local_1a8._M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1a8._M_pi)->_M_use_count =
                   (int)*(size_type *)&(local_1a8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1a8._M_pi)->_M_use_count =
                   (int)*(size_type *)&(local_1a8._M_pi)->_M_use_count + 1;
            }
          }
          local_158._24_8_ = local_1a8._M_pi;
          if (local_1b0 == (NodeDef *)0x0) {
            local_118._16_8_ = (element_type *)0x0;
            peStack_100 = (element_type *)0x0;
            _Var20._M_pi = local_1a8._M_pi;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)(local_118 + 0x10),(__fn *)local_1b0,__child_stack_03,
                       (int)local_1a8._M_pi,in_R8);
            _Var20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._16_8_;
            if (peStack_100 != (element_type *)0x0) {
              _Var20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded
              ;
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &(peStack_100->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &(peStack_100->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
          }
          iVar17 = (int)_Var20._M_pi;
          local_258._0_8_ = local_118._16_8_;
          local_258._8_8_ = peStack_100;
          trieste::NodeDef::push_back((NodeDef *)local_198._0_8_,(Node *)local_258);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          uVar9 = local_198._8_8_;
          uVar8 = local_198._0_8_;
          local_198._0_8_ = (NodeDef *)0x0;
          local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_60.def = (TokenDef *)Ident;
          trieste::operator/(&local_50,(Node *)local_208,&local_60);
          local_1f8._24_8_ =
               local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((element_type *)
              local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (int)*(size_type *)
                         &(local_50.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (int)*(size_type *)
                         &(local_50.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          if (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0) {
            local_118._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_118._8_8_ = (NodeDef *)0x0;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)local_118,
                       (__fn *)local_50.node.
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,__child_stack_04,iVar17,in_R8);
            if ((NodeDef *)local_118._8_8_ != (NodeDef *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_118._8_8_ + 8))->_M_pi
                     = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_118._8_8_ + 8))
                                ->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_118._8_8_ + 8))->_M_pi
                     = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_118._8_8_ + 8))
                                ->_M_pi + 1;
              }
            }
          }
          local_258._0_8_ = local_118._0_8_;
          local_258._8_8_ = local_118._8_8_;
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_258);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          local_68.def = (TokenDef *)Int;
          trieste::SourceDef::synthetic((SourceDef *)local_258,(string *)&local_228);
          local_258._16_8_ = (TokenDef *)0x0;
          local_240 = (undefined1 *)local_228._8_8_;
          trieste::NodeDef::create((NodeDef *)&local_98,&local_68,(Location *)local_258);
          uVar10 = local_158._24_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          local_258._0_8_ = local_98._M_pi;
          local_258._8_8_ = local_90._M_pi;
          if ((NodeDef *)local_90._M_pi != (NodeDef *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_90._M_pi)->_M_use_count)
                       ->_M_pi =
                   *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_90._M_pi)->_M_use_count)->_M_pi + 1;
              UNLOCK();
            }
            else {
              *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_90._M_pi)->_M_use_count)
                       ->_M_pi =
                   *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_90._M_pi)->_M_use_count)->_M_pi + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_258);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          make_typeargs(&local_a8,(Lookup *)local_208,SUB81(local_158._40_8_,0));
          local_258._0_8_ =
               local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_258._8_8_ =
               local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          if ((element_type *)
              local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (((_Rb_tree_header *)
               &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color =
                   (((_Rb_tree_header *)
                    &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
              UNLOCK();
            }
            else {
              (((_Rb_tree_header *)
               &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color =
                   (((_Rb_tree_header *)
                    &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_header)._M_color + _S_black;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_258);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          local_258._0_8_ = uVar8;
          local_258._8_8_ = uVar9;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(uVar9 + 8) = *(_Atomic_word *)(uVar9 + 8) + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar18,(Node *)local_258);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._32_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._32_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
          }
          if ((element_type *)
              local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          uVar18 = local_1f8._24_8_;
          if ((NodeDef *)local_90._M_pi != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
          }
          if ((NodeDef *)local_118._8_8_ != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          if ((element_type *)uVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
          }
          if ((element_type *)
              local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          if (peStack_100 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_100);
          }
          if ((element_type *)uVar10 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          }
          if ((element_type *)local_1a8._M_pi != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
          if ((NodeDef *)local_228._M_allocated_capacity != (NodeDef *)local_218) {
            operator_delete((void *)local_228._M_allocated_capacity,
                            (size_t)((long)(_func_int ***)local_218._0_8_ + 1));
          }
        }
      }
      local_258._0_8_ = Class;
      local_258._8_8_ = TypeAlias;
      local_258._16_8_ = Trait;
      local_240 = Function;
      local_1b0 = (NodeDef *)0x4;
      local_1c8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258;
      trieste::NodeDef::parent
                ((NodeDef *)&local_228,(initializer_list<trieste::Token> *)local_208._0_8_);
      uVar8 = local_208._8_8_;
      uVar18 = local_228._8_8_;
      local_208._0_8_ = local_228._M_allocated_capacity;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = (element_type *)0x0;
      local_208._8_8_ = uVar18;
      if (((element_type *)uVar8 != (element_type *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8),
         (element_type *)local_228._8_8_ != (element_type *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
      }
    } while ((NodeDef *)local_208._0_8_ != (NodeDef *)0x0);
  }
  peVar12 = local_b0;
  psVar15 = (((Nodes *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 0x50))->
              _M_use_count)->
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar21 = (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 0x60))->
                     _vptr__Sp_counted_base + -1;
  if (psVar15 < psVar21 &&
      psVar15 !=
      (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 0x60))->
               _vptr__Sp_counted_base) {
    do {
      peVar16 = (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (psVar21->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (psVar21->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar16;
      p_Var6 = (psVar21->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (psVar21->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
      (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = p_Var6;
      psVar15 = psVar15 + 1;
      psVar21 = psVar21 + -1;
    } while (psVar15 < psVar21);
  }
  trieste::NodeDef::pop_back((NodeDef *)local_258);
  uVar18 = local_208._8_8_;
  local_208._8_8_ = local_258._8_8_;
  local_208._0_8_ = local_258._0_8_;
  local_258._0_8_ = (TokenDef *)0x0;
  local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((element_type *)uVar18 != (element_type *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
  }
  local_258._0_8_ = TypeClassName;
  local_258._8_8_ = &TypeAliasName;
  local_258._16_8_ = TypeParamName;
  local_240 = TypeTraitName;
  pTVar14 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (local_258,&local_238,(TokenDef *)(local_208._0_8_ + 0x10));
  if (pTVar14 == &local_238) {
    if ((((Nodes *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 0x50))->_M_use_count)
        ->
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 0x60))->
                 _vptr__Sp_counted_base) {
      __assert_fail("!path->empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                    ,0x18a,"Node verona::make_fq(Lookup &, bool)");
    }
    trieste::NodeDef::pop_back((NodeDef *)&local_228);
    local_258._0_8_ = FQFunction;
    trieste::NodeDef::create((NodeDef *)(local_158 + 0x30),(Token *)local_258);
    local_258._0_8_ = FQType;
    trieste::NodeDef::create((NodeDef *)(local_1f8 + 0x20),(Token *)local_258);
    uVar18 = local_1f8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
        UNLOCK();
        local_258._8_8_ = local_1f8._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
          UNLOCK();
          goto LAB_00156644;
        }
      }
      else {
        *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
      }
      local_258._8_8_ = local_1f8._8_8_;
      *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
    }
LAB_00156644:
    trieste::NodeDef::push_back((NodeDef *)local_1f8._32_8_,(Node *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    pNVar23 = pNStack_1d0;
    uVar9 = local_1f8._32_8_;
    uVar8 = local_228._8_8_;
    local_1f8._32_8_ = (NodeDef *)0x0;
    pNStack_1d0 = (NodeDef *)0x0;
    if ((element_type *)local_228._8_8_ == (element_type *)0x0) {
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
        UNLOCK();
        local_258._8_8_ = local_228._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
          UNLOCK();
          goto LAB_001566cd;
        }
      }
      else {
        *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
      }
      local_258._8_8_ = local_228._8_8_;
      *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
    }
LAB_001566cd:
    local_258._0_8_ = local_228._M_allocated_capacity;
    trieste::NodeDef::push_back((NodeDef *)uVar9,(Node *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    local_258._0_8_ = uVar9;
    local_258._8_8_ = pNVar23;
    if (pNVar23 != (NodeDef *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4 = &(pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var4 = &(pNVar23->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
      }
    }
    trieste::NodeDef::push_back((NodeDef *)local_158._48_8_,(Node *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    peVar11 = peStack_120;
    uVar10 = local_158._48_8_;
    uVar9 = local_208._8_8_;
    local_158._48_8_ = (NodeDef *)0x0;
    peStack_120 = (element_type *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
        UNLOCK();
        local_258._8_8_ = local_208._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
          UNLOCK();
          goto LAB_00156797;
        }
      }
      else {
        *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
      }
      local_258._8_8_ = local_208._8_8_;
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
    }
LAB_00156797:
    local_258._0_8_ = local_208._0_8_;
    trieste::NodeDef::push_back((NodeDef *)uVar10,(Node *)local_258);
    _Var20._M_pi = extraout_RDX_04;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      _Var20._M_pi = extraout_RDX_05;
    }
    ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
    &(local_b0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->_M_ptr =
         (element_type *)uVar10;
    (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
     &(local_b0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->_M_refcount)._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11;
    peVar16 = local_b0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
      peVar16 = extraout_RAX_03;
      _Var20._M_pi = extraout_RDX_06;
    }
    if (pNVar23 != (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar23);
      peVar16 = extraout_RAX_04;
      _Var20._M_pi = extraout_RDX_07;
    }
    if ((element_type *)uVar8 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
      peVar16 = extraout_RAX_05;
      _Var20._M_pi = extraout_RDX_08;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
      peVar16 = extraout_RAX_06;
      _Var20._M_pi = extraout_RDX_09;
    }
    if (pNStack_1d0 != (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNStack_1d0);
      peVar16 = extraout_RAX_07;
      _Var20._M_pi = extraout_RDX_10;
    }
    uVar18 = local_228._8_8_;
    if (peStack_120 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_120);
      peVar16 = extraout_RAX_08;
      _Var20._M_pi = extraout_RDX_11;
      uVar18 = local_228._8_8_;
    }
  }
  else {
    local_258._0_8_ = FQType;
    trieste::NodeDef::create((NodeDef *)local_1c8,(Token *)local_258);
    uVar8 = local_1f8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
        UNLOCK();
        local_258._8_8_ = local_1f8._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
          UNLOCK();
          goto LAB_0015652f;
        }
      }
      else {
        *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
      }
      local_258._8_8_ = local_1f8._8_8_;
      *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
    }
LAB_0015652f:
    trieste::NodeDef::push_back((NodeDef *)local_1c8._0_8_,(Node *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    uVar10 = local_1c8._8_8_;
    uVar9 = local_1c8._0_8_;
    uVar18 = local_208._8_8_;
    local_1c8._0_8_ = (NodeDef *)0x0;
    local_1c8._8_8_ = (element_type *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
        UNLOCK();
        local_258._8_8_ = local_208._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
          UNLOCK();
          goto LAB_001565b8;
        }
      }
      else {
        *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
      }
      local_258._8_8_ = local_208._8_8_;
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
    }
LAB_001565b8:
    local_258._0_8_ = local_208._0_8_;
    trieste::NodeDef::push_back((NodeDef *)uVar9,(Node *)local_258);
    peVar16 = extraout_RAX;
    _Var20._M_pi = extraout_RDX_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      peVar16 = extraout_RAX_00;
      _Var20._M_pi = extraout_RDX_01;
    }
    ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
    &(peVar12->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->_M_ptr =
         (element_type *)uVar9;
    (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
     &(peVar12->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this)->_M_refcount)._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
      peVar16 = extraout_RAX_01;
      _Var20._M_pi = extraout_RDX_02;
    }
    uVar18 = local_1c8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
      peVar16 = extraout_RAX_02;
      _Var20._M_pi = extraout_RDX_03;
      uVar18 = local_1c8._8_8_;
    }
  }
  if ((element_type *)uVar18 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
    peVar16 = extraout_RAX_09;
    _Var20._M_pi = extraout_RDX_12;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    peVar16 = extraout_RAX_10;
    _Var20._M_pi = extraout_RDX_13;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    peVar16 = extraout_RAX_11;
    _Var20._M_pi = extraout_RDX_14;
  }
LAB_00156845:
  NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var20._M_pi;
  NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar16;
  return (Node)NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Node make_fq(Lookup& lookup, bool fresh)
  {
    if (!lookup.def->in({Class, TypeAlias, TypeParam, Trait, Function}))
      return lookup.def;

    Node path = TypePath;
    auto node = lookup.def;

    while (node)
    {
      if (node == Class)
      {
        path
          << (TypeClassName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeAlias)
      {
        path
          << (TypeAliasName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeParam)
      {
        path << (TypeParamName << clone(node / Ident));
      }
      else if (node == Trait)
      {
        path << (TypeTraitName << clone(node / Ident));
      }
      else if (node == Function)
      {
        auto arity = std::to_string((node / Params)->size());

        path
          << (Selector << clone(node / Ref) << clone(node / Ident)
                       << (Int ^ arity) << make_typeargs(node, lookup, fresh));
      }

      node = node->parent({Class, TypeAlias, Trait, Function});
    }

    std::reverse(path->begin(), path->end());
    node = path->pop_back();

    if (node->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}))
      return FQType << path << node;

    assert(!path->empty());
    auto t = path->pop_back();
    return FQFunction << (FQType << path << t) << node;
  }